

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O2

string * str_first_non_empty(string *__return_storage_ptr__,
                            initializer_list<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *l)

{
  long lVar1;
  iterator pbVar2;
  allocator<char> local_9;
  
  pbVar2 = l->_M_array;
  lVar1 = l->_M_len << 5;
  while( true ) {
    if (lVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_9);
      return __return_storage_ptr__;
    }
    if (pbVar2->_M_string_length != 0) break;
    pbVar2 = pbVar2 + 1;
    lVar1 = lVar1 + -0x20;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string str_first_non_empty (const std::initializer_list<const std::string>& l)
{
    for (const std::string& s: l)
        if (!s.empty())
            return s;
    return "";
}